

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDitheringTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles2::Functional::DitheringCase::drawAndCheckGradient
          (DitheringCase *this,bool isVerticallyIncreasing,Vec4 *highColor)

{
  ostringstream *poVar1;
  TextureFormat TVar2;
  RenderContext *context;
  int iVar3;
  byte bVar4;
  char *pcVar5;
  bool bVar6;
  deUint32 dVar7;
  int iVar8;
  int iVar9;
  GLenum GVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Vec4 *pVVar11;
  ostream *poVar12;
  ostream *poVar13;
  Surface *pSVar14;
  long lVar15;
  void *__buf;
  void *__buf_00;
  uint uVar16;
  char *pcVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  Surface renderedImg;
  Vec4 inputClr;
  Surface errorMask;
  Random rnd;
  Surface local_310;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  string local_2d0;
  ulong local_2b0;
  Vec4 *local_2a8;
  Surface local_2a0;
  Vec4 local_288;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [32];
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [4];
  ios_base local_1f0 [264];
  deRandom local_e8;
  Quad local_d8;
  
  TVar2 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_2a8 = highColor;
  dVar7 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_e8,dVar7);
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar8 = *(int *)CONCAT44(extraout_var,iVar8);
  if (0xff < iVar8) {
    iVar8 = 0x100;
  }
  iVar9 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar9 = *(int *)(CONCAT44(extraout_var_00,iVar9) + 4);
  iVar20 = 0x100;
  if (iVar9 < 0x100) {
    iVar20 = iVar9;
  }
  iVar9 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar9 = *(int *)CONCAT44(extraout_var_01,iVar9);
  dVar7 = deRandom_getUint32(&local_e8);
  uVar18 = dVar7 % ((iVar9 - iVar8) + 1U);
  iVar9 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar9 = *(int *)(CONCAT44(extraout_var_02,iVar9) + 4);
  dVar7 = deRandom_getUint32(&local_e8);
  uVar16 = dVar7 % ((iVar9 - iVar20) + 1U);
  local_288.m_data[0] = 0.0;
  local_288.m_data[1] = 0.0;
  local_288.m_data[2] = 0.0;
  local_288.m_data[3] = 0.0;
  local_d8.posA.m_data[0] = -1.0;
  local_d8.posA.m_data[1] = -1.0;
  local_d8.posB.m_data[0] = 1.0;
  local_d8.posB.m_data[1] = 1.0;
  memset(local_d8.color,0,0x90);
  tcu::Surface::Surface(&local_310,iVar8,iVar20);
  glwViewport(uVar18,uVar16,iVar8,iVar20);
  GVar10 = glwGetError();
  glu::checkError(GVar10,"glViewport(viewportX, viewportY, viewportWid, viewportHei)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDitheringTests.cpp"
                  ,0xfe);
  poVar1 = (ostringstream *)(local_268 + 8);
  local_268._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Dithering is ",0xd);
  pcVar17 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if ((ulong)this->m_ditheringEnabled != 0) {
    pcVar17 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,pcVar17 + 0x27,8 - (ulong)this->m_ditheringEnabled);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_1f0);
  if (this->m_ditheringEnabled == true) {
    glwEnable(0xbd0);
    dVar7 = glwGetError();
    iVar9 = 0x103;
    pcVar17 = "glEnable(GL_DITHER)";
  }
  else {
    glwDisable(0xbd0);
    dVar7 = glwGetError();
    iVar9 = 0x105;
    pcVar17 = "glDisable(GL_DITHER)";
  }
  glu::checkError(dVar7,pcVar17,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDitheringTests.cpp"
                  ,iVar9);
  poVar1 = (ostringstream *)(local_268 + 8);
  local_268._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Drawing a ",10);
  pcVar17 = "horizontally";
  if (isVerticallyIncreasing) {
    pcVar17 = "vertically";
  }
  local_2b0 = (ulong)!isVerticallyIncreasing;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar17,local_2b0 * 2 + 10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," increasing gradient",0x14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_1f0);
  local_d8.color[0].m_data[0] = 0.0;
  local_d8.color[0].m_data[1] = 0.0;
  local_d8.color[0].m_data[2] = 0.0;
  local_d8.color[0].m_data[3] = 0.0;
  pVVar11 = &local_288;
  if (isVerticallyIncreasing) {
    pVVar11 = local_2a8;
  }
  local_d8.color[1].m_data._0_8_ = *(undefined8 *)pVVar11->m_data;
  local_d8.color[1].m_data._8_8_ = *(undefined8 *)(pVVar11->m_data + 2);
  pVVar11 = &local_288;
  if (!isVerticallyIncreasing) {
    pVVar11 = local_2a8;
  }
  local_d8.color[2].m_data._0_8_ = *(undefined8 *)pVVar11->m_data;
  local_d8.color[2].m_data._8_8_ = *(undefined8 *)(pVVar11->m_data + 2);
  local_d8.color[3].m_data._0_8_ = *(undefined8 *)local_2a8->m_data;
  local_d8.color[3].m_data._8_8_ = *(undefined8 *)(local_2a8->m_data + 2);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&local_d8);
  context = this->m_renderCtx;
  local_2f8._0_4_ = RGBA;
  local_2f8._4_4_ = UNORM_INT8;
  if ((void *)local_310.m_pixels.m_cap != (void *)0x0) {
    local_310.m_pixels.m_cap = (size_t)local_310.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_268,(TextureFormat *)local_2f8,local_310.m_width,
             local_310.m_height,1,(void *)local_310.m_pixels.m_cap);
  glu::readPixels(context,uVar18,uVar16,(PixelBufferAccess *)local_268);
  GVar10 = glwGetError();
  glu::checkError(GVar10,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDitheringTests.cpp"
                  ,0x111);
  pcVar17 = "HorGradient";
  if (isVerticallyIncreasing) {
    pcVar17 = "VerGradient";
  }
  pcVar5 = "HorGradient";
  if (isVerticallyIncreasing) {
    pcVar5 = "VerGradient";
  }
  local_2f8 = (undefined1  [8])&local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,pcVar17,pcVar5 + 0xb);
  pcVar17 = "Horizontal gradient";
  if (isVerticallyIncreasing) {
    pcVar17 = "Vertical gradient";
  }
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d0,pcVar17,pcVar17 + local_2b0 * 2 + 0x11);
  pSVar14 = &local_310;
  tcu::LogImage::LogImage
            ((LogImage *)local_268,(string *)local_2f8,&local_2d0,pSVar14,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_268,TVar2.order,__buf,(size_t)pSVar14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_p != local_238) {
    operator_delete(local_248._M_p,local_238[0]._M_allocated_capacity + 1);
  }
  if (local_268._0_8_ != (long)local_268 + 0x10) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if (local_2f8 != (undefined1  [8])&local_2e8) {
    operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity + 1);
  }
  tcu::Surface::Surface(&local_2a0,iVar8,iVar20);
  if (0 < local_310.m_height) {
    poVar1 = (ostringstream *)(local_268 + 8);
    iVar20 = 0;
    bVar22 = true;
    local_278 = local_288.m_data[0];
    fStack_274 = local_288.m_data[1];
    fStack_270 = local_288.m_data[2];
    fStack_26c = local_288.m_data[3];
    iVar8 = local_310.m_width;
    iVar9 = local_310.m_height;
    do {
      if (0 < iVar8) {
        iVar19 = 0;
        do {
          iVar9 = iVar19;
          if (isVerticallyIncreasing) {
            iVar9 = iVar20;
          }
          iVar3 = local_310.m_height;
          if (!isVerticallyIncreasing) {
            iVar3 = iVar8;
          }
          fVar23 = ((float)iVar9 + 0.5) / (float)iVar3;
          fVar24 = 1.0 - fVar23;
          fStack_2f0 = local_2a8->m_data[2] * fVar23 + fVar24 * fStack_270;
          fStack_2ec = local_2a8->m_data[3] * fVar23 + fVar24 * fStack_26c;
          local_2f8._4_4_ = local_2a8->m_data[1] * fVar23 + fVar24 * fStack_274;
          local_2f8._0_4_ = local_2a8->m_data[0] * fVar23 + fVar24 * local_278;
          local_268._0_4_ =
               *(ChannelOrder *)
                ((long)local_310.m_pixels.m_ptr + (long)(iVar8 * iVar20 + iVar19) * 4);
          bVar6 = checkColor(this,(Vec4 *)local_2f8,(RGBA *)local_268,bVar22);
          lVar15 = (long)(local_2a0.m_width * iVar20 + iVar19);
          if (bVar6) {
            *(undefined4 *)((long)local_2a0.m_pixels.m_ptr + lVar15 * 4) = 0xff00ff00;
          }
          else {
            *(undefined4 *)((long)local_2a0.m_pixels.m_ptr + lVar15 * 4) = 0xff0000ff;
            if (bVar22 != false) {
              local_268._0_8_ = TVar2;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"First failure at pixel (",0x18);
              std::ostream::operator<<(poVar1,iVar19);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::operator<<(poVar1,iVar20);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,") (not printing further errors)",0x1f);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_1f0);
              bVar22 = false;
            }
          }
          iVar19 = iVar19 + 1;
          iVar8 = local_310.m_width;
          iVar9 = local_310.m_height;
        } while (iVar19 < local_310.m_width);
      }
      iVar20 = iVar20 + 1;
    } while (iVar20 < iVar9);
    if (bVar22 == false) {
      local_2f8 = (undefined1  [8])&local_2e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"ColorChoiceErrorMask","")
      ;
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2d0,"Error mask for color choices","");
      pSVar14 = &local_2a0;
      tcu::LogImage::LogImage
                ((LogImage *)local_268,(string *)local_2f8,&local_2d0,pSVar14,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_268,TVar2.order,__buf_00,(size_t)pSVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_p != local_238) {
        operator_delete(local_248._M_p,local_238[0]._M_allocated_capacity + 1);
      }
      if (local_268._0_8_ != (long)local_268 + 0x10) {
        operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != (undefined1  [8])&local_2e8) {
        operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity + 1);
      }
      tcu::Surface::~Surface(&local_2a0);
LAB_0038d5b8:
      bVar22 = false;
      goto LAB_0038d5ba;
    }
  }
  tcu::Surface::~Surface(&local_2a0);
  bVar22 = true;
  if (this->m_ditheringEnabled == false) {
    iVar8 = local_310.m_height;
    iVar9 = local_310.m_width;
    if (isVerticallyIncreasing) {
      iVar8 = local_310.m_width;
      iVar9 = local_310.m_height;
    }
    if (0 < iVar9) {
      iVar20 = 0;
      bVar4 = 0;
      do {
        if (0 < iVar8) {
          iVar19 = 0;
          uVar16 = 0;
          do {
            iVar21 = iVar19;
            iVar3 = iVar20;
            if (isVerticallyIncreasing) {
              iVar21 = iVar20;
              iVar3 = iVar19;
            }
            uVar18 = *(uint *)((long)local_310.m_pixels.m_ptr +
                              (long)(local_310.m_width * iVar21 + iVar3) * 4);
            bVar22 = uVar18 != uVar16 && iVar19 != 0;
            if ((bool)(bVar22 & bVar4)) {
              local_268._0_8_ = TVar2;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_268 + 8));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_268 + 8),"Failure: colors should be constant per ",0x27);
              pcVar17 = "column";
              if (isVerticallyIncreasing) {
                pcVar17 = "row";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_268 + 8),pcVar17,local_2b0 * 3 + 3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_268 + 8),
                         " (since dithering is disabled), but the color at position (",0x3b);
              std::ostream::operator<<(local_268 + 8,iVar3);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_268 + 8),", ",2);
              std::ostream::operator<<(local_268 + 8,iVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_268 + 8),") is ",5);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_268 + 8),"RGBA(",5);
              poVar12 = (ostream *)std::ostream::operator<<(local_268 + 8,uVar18 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar18 >> 8 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar18 >> 0x10 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar18 >> 0x18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,")",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_268 + 8)," and does not equal the color at (",0x22);
              iVar8 = iVar20;
              if (isVerticallyIncreasing) {
                iVar8 = iVar19 + -1;
              }
              poVar12 = (ostream *)(local_268 + 8);
              std::ostream::operator<<(poVar12,iVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
              iVar8 = iVar19 + -1;
              if (isVerticallyIncreasing) {
                iVar8 = iVar20;
              }
              std::ostream::operator<<(poVar12,iVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"), which is ",0xc);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"RGBA(",5);
              poVar13 = (ostream *)std::ostream::operator<<(poVar12,uVar16 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar16 >> 8 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar16 >> 0x10 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar16 >> 0x18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,")",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar12);
              std::ios_base::~ios_base(local_1f0);
              goto LAB_0038d5b8;
            }
            bVar4 = bVar4 | bVar22;
            iVar19 = iVar19 + 1;
            uVar16 = uVar18;
          } while (iVar8 != iVar19);
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 != iVar9);
      bVar22 = true;
    }
  }
LAB_0038d5ba:
  tcu::Surface::~Surface(&local_310);
  return bVar22;
}

Assistant:

bool DitheringCase::drawAndCheckGradient (const bool isVerticallyIncreasing, const Vec4& highColor) const
{
	TestLog&					log					= m_testCtx.getLog();
	Random						rnd					(deStringHash(getName()));
	const int					maxViewportWid		= 256;
	const int					maxViewportHei		= 256;
	const int					viewportWid			= de::min(m_renderCtx.getRenderTarget().getWidth(), maxViewportWid);
	const int					viewportHei			= de::min(m_renderCtx.getRenderTarget().getHeight(), maxViewportHei);
	const int					viewportX			= rnd.getInt(0, m_renderCtx.getRenderTarget().getWidth() - viewportWid);
	const int					viewportY			= rnd.getInt(0, m_renderCtx.getRenderTarget().getHeight() - viewportHei);
	const Vec4					quadClr0			(0.0f, 0.0f, 0.0f, 0.0f);
	const Vec4&					quadClr1			= highColor;
	Quad						quad;
	Surface						renderedImg			(viewportWid, viewportHei);

	GLU_CHECK_CALL(glViewport(viewportX, viewportY, viewportWid, viewportHei));

	log << TestLog::Message << "Dithering is " << (m_ditheringEnabled ? "enabled" : "disabled") << TestLog::EndMessage;

	if (m_ditheringEnabled)
		GLU_CHECK_CALL(glEnable(GL_DITHER));
	else
		GLU_CHECK_CALL(glDisable(GL_DITHER));

	log << TestLog::Message << "Drawing a " << (isVerticallyIncreasing ? "vertically" : "horizontally") << " increasing gradient" << TestLog::EndMessage;

	quad.color[0] = quadClr0;
	quad.color[1] = isVerticallyIncreasing ? quadClr1 : quadClr0;
	quad.color[2] = isVerticallyIncreasing ? quadClr0 : quadClr1;
	quad.color[3] = quadClr1;

	m_renderer->render(quad);

	glu::readPixels(m_renderCtx, viewportX, viewportY, renderedImg.getAccess());
	GLU_CHECK_MSG("glReadPixels()");

	log << TestLog::Image(isVerticallyIncreasing ? "VerGradient"		: "HorGradient",
						  isVerticallyIncreasing ? "Vertical gradient"	: "Horizontal gradient",
						  renderedImg);

	// Validate, at each pixel, that each color channel is one of its two allowed values.

	{
		Surface		errorMask		(viewportWid, viewportHei);
		bool		colorChoicesOk	= true;

		for (int y = 0; y < renderedImg.getHeight(); y++)
		{
			for (int x = 0; x < renderedImg.getWidth(); x++)
			{
				const float		inputF		= ((float)(isVerticallyIncreasing ? y : x) + 0.5f) / (float)(isVerticallyIncreasing ? renderedImg.getHeight() : renderedImg.getWidth());
				const Vec4		inputClr	= (1.0f-inputF)*quadClr0 + inputF*quadClr1;

				if (!checkColor(inputClr, renderedImg.getPixel(x, y), colorChoicesOk))
				{
					errorMask.setPixel(x, y, tcu::RGBA::red());

					if (colorChoicesOk)
					{
						log << TestLog::Message << "First failure at pixel (" << x << ", " << y << ") (not printing further errors)" << TestLog::EndMessage;
						colorChoicesOk = false;
					}
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA::green());
			}
		}

		if (!colorChoicesOk)
		{
			log << TestLog::Image("ColorChoiceErrorMask", "Error mask for color choices", errorMask);
			return false;
		}
	}

	// When dithering is disabled, the color selection must be coordinate-independent - i.e. the colors must be constant in the gradient's constant direction.

	if (!m_ditheringEnabled)
	{
		const int	increasingDirectionSize	= isVerticallyIncreasing ? renderedImg.getHeight() : renderedImg.getWidth();
		const int	constantDirectionSize	= isVerticallyIncreasing ? renderedImg.getWidth() : renderedImg.getHeight();
		bool		colorHasChanged			= false;

		for (int incrPos = 0; incrPos < increasingDirectionSize; incrPos++)
		{
			tcu::RGBA prevConstantDirectionPix;
			for (int constPos = 0; constPos < constantDirectionSize; constPos++)
			{
				const int			x		= isVerticallyIncreasing ? constPos : incrPos;
				const int			y		= isVerticallyIncreasing ? incrPos : constPos;
				const tcu::RGBA		clr		= renderedImg.getPixel(x, y);

				if (constPos > 0 && clr != prevConstantDirectionPix)
				{
					// Allow color to change once to take into account possibly
					// discontinuity between triangles
					if (colorHasChanged)
					{
						log << TestLog::Message
							<< "Failure: colors should be constant per " << (isVerticallyIncreasing ? "row" : "column")
							<< " (since dithering is disabled), but the color at position (" << x << ", " << y << ") is " << clr
							<< " and does not equal the color at (" << (isVerticallyIncreasing ? x-1 : x) << ", " << (isVerticallyIncreasing ? y : y-1) << "), which is " << prevConstantDirectionPix
							<< TestLog::EndMessage;

						return false;
					}
					else
						colorHasChanged = true;
				}

				prevConstantDirectionPix = clr;
			}
		}
	}

	return true;
}